

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

char * __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::SnailAlloc
          (HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          Recycler *recycler,TBlockAllocatorType *allocator,size_t sizeCat,size_t size,
          ObjectInfoBits attributes,bool nothrow)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  char *pcVar6;
  undefined8 *in_FS_OFFSET;
  
  if ((recycler->recyclerFlagsTable->Verbose == true) &&
     (bVar3 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase),
     bVar3)) {
    Output::Print(L"In SnailAlloc [Size: 0x%x, Attributes: 0x%x]\n",sizeCat,(ulong)attributes);
  }
  if ((this->super_HeapBucket).sizeCat != sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x29a,"(sizeCat == this->sizeCat)","sizeCat == this->sizeCat");
    if (!bVar3) goto LAB_0021f18e;
    *puVar1 = 0;
  }
  if (InternalObjectInfoBitMask < attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x29b,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar3) goto LAB_0021f18e;
    *puVar1 = 0;
  }
  pcVar6 = TryAlloc(this,recycler,allocator,sizeCat,attributes);
  if (pcVar6 == (char *)0x0) {
    if (recycler->disableCollectOnAllocationHeuristics == true) {
      uVar4 = Recycler::FinishConcurrent<(Memory::CollectionFlags)270008320>(recycler);
    }
    else {
      uVar4 = Recycler::CollectNow<(Memory::CollectionFlags)404819971>(recycler);
    }
    if ((recycler->recyclerFlagsTable->Verbose == true) &&
       (bVar3 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase),
       bVar3)) {
      Output::Print(L"TryAlloc failed, forced collection on allocation [Collected: %d]\n",
                    (ulong)uVar4);
    }
    if (uVar4 == 0) {
      BVar5 = Recycler::IsConcurrentSweepExecutingState(recycler);
      if ((BVar5 != 0) &&
         ((ulong)(uint)Js::Configuration::Global._132484_4_ <
          (recycler->autoHeap).uncollectedNewPageCount)) {
        Recycler::FinishConcurrent<(Memory::CollectionFlags)147456>(recycler);
        pcVar6 = TryAlloc(this,recycler,allocator,sizeCat,attributes);
        if (pcVar6 != (char *)0x0) {
          return pcVar6;
        }
      }
      pcVar6 = TryAllocFromNewHeapBlock(this,recycler,allocator,sizeCat,size,attributes);
      if (pcVar6 != (char *)0x0) {
        return pcVar6;
      }
      if ((recycler->recyclerFlagsTable->Verbose == true) &&
         (bVar3 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase),
         bVar3)) {
        Output::Print(L"TryAllocFromNewHeapBlock failed, forcing in-thread collection\n");
      }
      Recycler::CollectNow<(Memory::CollectionFlags)16384>(recycler);
    }
    if (InternalObjectInfoBitMask < attributes) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                         ,0xfe,"((attributes & InternalObjectInfoBitMask) == attributes)",
                         "(attributes & InternalObjectInfoBitMask) == attributes");
      if (!bVar3) {
LAB_0021f18e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    pcVar6 = SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
             InlinedAllocImpl<true>(allocator,recycler,sizeCat,attributes);
    if (pcVar6 == (char *)0x0) {
      if ((recycler->recyclerFlagsTable->Verbose == true) &&
         (bVar3 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase),
         bVar3)) {
        Output::Print(L"SlowAlloc failed\n");
      }
      pcVar6 = TryAlloc(this,recycler,allocator,sizeCat,attributes);
      if (pcVar6 == (char *)0x0) {
        if ((recycler->recyclerFlagsTable->Verbose == true) &&
           (bVar3 = Js::Phases::IsEnabled
                              (&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase), bVar3))
        {
          Output::Print(L"TryAlloc failed\n");
        }
        pcVar6 = TryAllocFromNewHeapBlock(this,recycler,allocator,sizeCat,size,attributes);
        if (pcVar6 == (char *)0x0) {
          if ((recycler->recyclerFlagsTable->Verbose == true) &&
             (bVar3 = Js::Phases::IsEnabled
                                (&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase), bVar3)
             ) {
            Output::Print(L"TryAllocFromNewHeapBlock failed- triggering OOM handler");
          }
          if (!nothrow) {
            Recycler::OutOfMemory(recycler);
          }
          pcVar6 = (char *)0x0;
        }
      }
    }
  }
  return pcVar6;
}

Assistant:

char *
HeapBucketT<TBlockType>::SnailAlloc(Recycler * recycler, TBlockAllocatorType * allocator, DECLSPEC_GUARD_OVERFLOW size_t sizeCat, size_t size, ObjectInfoBits attributes, bool nothrow)
{
    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("In SnailAlloc [Size: 0x%x, Attributes: 0x%x]\n"), sizeCat, attributes);

    Assert(sizeCat == this->sizeCat);
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    char * memBlock = this->TryAlloc(recycler, allocator, sizeCat, attributes);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

#if ENABLE_CONCURRENT_GC
    // No free memory, try to collect with allocated bytes and time heuristic, and concurrently
    BOOL collected = recycler->disableCollectOnAllocationHeuristics ? recycler->FinishConcurrent<FinishConcurrentOnAllocation>() :
        recycler->CollectNow<CollectOnAllocation>();
#else
    BOOL collected = recycler->disableCollectOnAllocationHeuristics ? FALSE : recycler->CollectNow<CollectOnAllocation>();
#endif

    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("TryAlloc failed, forced collection on allocation [Collected: %d]\n"), collected);

    if (!collected)
    {
#if ENABLE_CONCURRENT_GC
#if ENABLE_PARTIAL_GC
        // wait for background sweeping finish if there are too many pages allocated during background sweeping
        if (recycler->IsConcurrentSweepExecutingState() && recycler->autoHeap.uncollectedNewPageCount > (uint)CONFIG_FLAG(NewPagesCapDuringBGSweeping))
#else
        if (recycler->IsConcurrentSweepExecutingState())
#endif
        {
            recycler->FinishConcurrent<ForceFinishCollection>();
            memBlock = this->TryAlloc(recycler, allocator, sizeCat, attributes);
            if (memBlock != nullptr)
            {
                return memBlock;
            }
        }
#endif

        // We didn't collect, try to add a new heap block
        memBlock = TryAllocFromNewHeapBlock(recycler, allocator, sizeCat, size, attributes);
        if (memBlock != nullptr)
        {
            return memBlock;
        }

        // Can't even allocate a new block, we need force a collection and
        //allocate some free memory, add a new heap block again, or throw out of memory
        AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("TryAllocFromNewHeapBlock failed, forcing in-thread collection\n"));
        recycler->CollectNow<CollectNowForceInThread>();
    }

    // Collection might trigger finalizer, which might allocate memory. So the allocator
    // might have a heap block already, try to allocate from that first
    memBlock = allocator->template SlowAlloc<true /* allow fault injection */>(recycler, sizeCat, attributes);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("SlowAlloc failed\n"));

    // do the allocation
    memBlock = this->TryAlloc(recycler, allocator, sizeCat, attributes);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("TryAlloc failed\n"));
    // add a heap block if there are no preallocated memory left.
    memBlock = TryAllocFromNewHeapBlock(recycler, allocator, sizeCat, size, attributes);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("TryAllocFromNewHeapBlock failed- triggering OOM handler"));

    if (nothrow == false)
    {
        // Can't add a heap block, we are out of memory
        // Since we're allowed to throw, throw right here
        recycler->OutOfMemory();
    }

    return nullptr;
}